

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_unpack(bcf1_t *b,int which)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  int32_t iVar6;
  int *piVar7;
  char **ppcVar8;
  ulong uVar9;
  int *piVar10;
  bcf_info_t *pbVar11;
  long lVar12;
  bcf_fmt_t *pbVar13;
  long lVar14;
  int *piVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint8_t *puVar19;
  undefined8 uStack_70;
  int aiStack_68 [2];
  undefined1 local_60 [8];
  kstring_t tmp;
  int *local_38;
  
  if ((b->shared).l != 0) {
    uStack_70 = 7;
    uVar17 = 7;
    if ((which & 4U) == 0) {
      uVar17 = (uint)which >> 1 & 1;
    }
    uVar17 = uVar17 | which;
    piVar15 = aiStack_68;
    if (((uVar17 & 1) != 0) && (piVar15 = aiStack_68, (b->unpacked & 1) == 0)) {
      puVar19 = (uint8_t *)(b->shared).s;
      local_60 = (undefined1  [8])0x0;
      tmp.m = (size_t)(b->d).id;
      tmp.l = (size_t)(b->d).m_id;
      uStack_70 = 0x115eae;
      piVar7 = (int *)bcf_fmt_sized_array((kstring_t *)local_60,puVar19);
      b->unpack_size[0] = (int)piVar7 - (int)puVar19;
      uStack_70 = 0x115ecb;
      local_38 = piVar7;
      kputc(0,(kstring_t *)local_60);
      (b->d).id = (char *)tmp.m;
      (b->d).m_id = (int)tmp.l;
      local_60 = (undefined1  [8])0x0;
      tmp.m = (size_t)(b->d).als;
      tmp.l = (long)(b->d).m_als;
      uVar9 = *(ulong *)&b->field_0x10;
      lVar12 = -(ulong)(((uint)(uVar9 >> 0x10) & 0xffff) * 4 + 0xf & 0xfffffff0);
      piVar15 = (int *)((long)aiStack_68 + lVar12);
      tmp.s = (char *)piVar7;
      for (uVar18 = 0; uVar9 = uVar9 >> 0x10 & 0xffff, uVar18 < uVar9; uVar18 = uVar18 + 1) {
        *(undefined4 *)((long)piVar15 + uVar18 * 4) = local_60._0_4_;
        *(undefined8 *)((long)aiStack_68 + lVar12 + -8) = 0x115f28;
        piVar7 = (int *)bcf_fmt_sized_array((kstring_t *)local_60,(uint8_t *)piVar7);
        *(undefined8 *)((long)aiStack_68 + lVar12 + -8) = 0x115f35;
        kputc(0,(kstring_t *)local_60);
        uVar9 = *(ulong *)&b->field_0x10;
      }
      b->unpack_size[1] = (int)piVar7 - (int)tmp.s;
      (b->d).als = (char *)tmp.m;
      (b->d).m_als = (int)tmp.l;
      iVar16 = (int)uVar9;
      if ((b->d).m_allele < iVar16) {
        uVar5 = iVar16 - 1;
        uVar5 = (int)uVar5 >> 1 | uVar5;
        uVar5 = (int)uVar5 >> 2 | uVar5;
        uVar5 = (int)uVar5 >> 4 | uVar5;
        uVar5 = (int)uVar5 >> 8 | uVar5;
        uVar5 = (int)uVar5 >> 0x10 | uVar5;
        (b->d).m_allele = uVar5 + 1;
        ppcVar8 = (b->d).allele;
        *(undefined8 *)((long)aiStack_68 + lVar12 + -8) = 0x115f9d;
        ppcVar8 = (char **)realloc(ppcVar8,(long)(int)uVar5 * 8 + 8);
        (b->d).allele = ppcVar8;
      }
      for (uVar9 = 0; uVar9 < *(ushort *)&b->field_0x12; uVar9 = uVar9 + 1) {
        (b->d).allele[uVar9] = (b->d).als + *(int *)((long)piVar15 + uVar9 * 4);
      }
      *(byte *)&b->unpacked = (byte)b->unpacked | 1;
    }
    if (((uVar17 & 2) != 0) && (uVar5 = b->unpacked, (uVar5 & 2) == 0)) {
      pcVar4 = (b->shared).s;
      piVar7 = (int *)(pcVar4 + (long)b->unpack_size[1] + (long)b->unpack_size[0]);
      local_38 = piVar7;
      if ((byte)pcVar4[(long)b->unpack_size[1] + (long)b->unpack_size[0]] < 0x10) {
        piVar10 = (int *)((long)piVar7 + 1);
        (b->d).n_flt = 0;
      }
      else {
        *(undefined8 *)((long)piVar15 + -8) = 0x11602c;
        iVar6 = bcf_dec_size((uint8_t *)piVar7,(uint8_t **)&local_38,(int *)local_60);
        (b->d).n_flt = iVar6;
        if ((b->d).m_flt < iVar6) {
          uVar5 = (int)(iVar6 - 1U) >> 1 | iVar6 - 1U;
          uVar5 = (int)uVar5 >> 2 | uVar5;
          uVar5 = (int)uVar5 >> 4 | uVar5;
          uVar5 = (int)uVar5 >> 8 | uVar5;
          uVar5 = (int)uVar5 >> 0x10 | uVar5;
          (b->d).m_flt = uVar5 + 1;
          piVar10 = (b->d).flt;
          *(undefined8 *)((long)piVar15 + -8) = 0x116072;
          piVar10 = (int *)realloc(piVar10,(long)(int)uVar5 * 4 + 4);
          (b->d).flt = piVar10;
        }
        piVar10 = local_38;
        for (lVar12 = 0; lVar12 < (b->d).n_flt; lVar12 = lVar12 + 1) {
          if (local_60._0_4_ == 2) {
            iVar16 = (int)(short)*piVar10;
            piVar10 = (int *)((long)piVar10 + 2);
          }
          else if (local_60._0_4_ == 1) {
            iVar16 = (int)(char)(uint8_t)*piVar10;
            piVar10 = (int *)((long)piVar10 + 1);
          }
          else {
            iVar16 = *piVar10;
            piVar10 = piVar10 + 1;
          }
          (b->d).flt[lVar12] = iVar16;
        }
        uVar5 = b->unpacked;
      }
      b->unpack_size[2] = (int)piVar10 - (int)piVar7;
      b->unpacked = uVar5 | 2;
    }
    if (((uVar17 & 4) != 0) && ((b->unpacked & 4) == 0)) {
      iVar16 = b->unpack_size[0];
      pcVar4 = (b->shared).s;
      iVar2 = b->unpack_size[1];
      iVar3 = b->unpack_size[2];
      if ((b->d).m_info < (int)(uint)*(ushort *)&b->field_0x10) {
        uVar17 = *(ushort *)&b->field_0x10 - 1;
        uVar17 = (int)uVar17 >> 1 | uVar17;
        uVar17 = (int)uVar17 >> 2 | uVar17;
        uVar17 = (int)uVar17 >> 4 | uVar17;
        uVar17 = (int)uVar17 >> 8 | uVar17;
        uVar17 = (int)uVar17 >> 0x10 | uVar17;
        (b->d).m_info = uVar17 + 1;
        pbVar11 = (b->d).info;
        *(undefined8 *)((long)piVar15 + -8) = 0x11614c;
        pbVar11 = (bcf_info_t *)realloc(pbVar11,(long)(int)uVar17 * 0x20 + 0x20);
        (b->d).info = pbVar11;
      }
      *(undefined8 *)((long)piVar15 + -8) = 0x1c;
      lVar12 = *(long *)((long)piVar15 + -8);
      puVar19 = (uint8_t *)(pcVar4 + (long)iVar3 + (long)iVar2 + (long)iVar16);
      for (lVar14 = 0; lVar14 < (b->d).m_info; lVar14 = lVar14 + 1) {
        puVar1 = (uint *)((long)&((b->d).info)->key + lVar12);
        *puVar1 = *puVar1 & 0x7fffffff;
        lVar12 = lVar12 + 0x20;
      }
      lVar12 = 0;
      for (uVar9 = 0; uVar9 < *(ushort *)&b->field_0x10; uVar9 = uVar9 + 1) {
        pbVar11 = (b->d).info;
        *(undefined8 *)((long)piVar15 + -8) = 0x11619c;
        puVar19 = bcf_unpack_info_core1(puVar19,(bcf_info_t *)((long)&pbVar11->key + lVar12));
        lVar12 = lVar12 + 0x20;
      }
      *(byte *)&b->unpacked = (byte)b->unpacked | 4;
    }
    if ((((which & 8U) != 0) && (*(ulong *)&b->field_0x10 >> 0x28 != 0)) && ((b->unpacked & 8) == 0)
       ) {
      puVar19 = (uint8_t *)(b->indiv).s;
      uVar17 = (uint)(*(ulong *)&b->field_0x10 >> 0x20) & 0xff;
      if ((b->d).m_fmt < (int)uVar17) {
        uVar17 = uVar17 - 1;
        uVar17 = (int)uVar17 >> 1 | uVar17;
        uVar17 = (int)uVar17 >> 2 | uVar17;
        uVar17 = (int)uVar17 >> 4 | uVar17;
        uVar17 = (int)uVar17 >> 8 | uVar17;
        uVar17 = (int)uVar17 >> 0x10 | uVar17;
        (b->d).m_fmt = uVar17 + 1;
        pbVar13 = (b->d).fmt;
        *(undefined8 *)((long)piVar15 + -8) = 0x11622a;
        pbVar13 = (bcf_fmt_t *)realloc(pbVar13,(long)(int)uVar17 * 0x20 + 0x20);
        (b->d).fmt = pbVar13;
      }
      *(undefined8 *)((long)piVar15 + -8) = 0x1c;
      lVar12 = *(long *)((long)piVar15 + -8);
      for (lVar14 = 0; lVar14 < (b->d).m_fmt; lVar14 = lVar14 + 1) {
        puVar1 = (uint *)((long)&((b->d).fmt)->id + lVar12);
        *puVar1 = *puVar1 & 0x7fffffff;
        lVar12 = lVar12 + 0x20;
      }
      lVar12 = 0;
      for (uVar9 = 0; uVar18 = *(ulong *)&b->field_0x10, uVar9 < (uVar18 >> 0x20 & 0xff);
          uVar9 = uVar9 + 1) {
        pbVar13 = (b->d).fmt;
        *(undefined8 *)((long)piVar15 + -8) = 0x116285;
        puVar19 = bcf_unpack_fmt_core1
                            (puVar19,(uint)(uVar18 >> 0x28),
                             (bcf_fmt_t *)((long)&pbVar13->id + lVar12));
        lVar12 = lVar12 + 0x20;
      }
      *(byte *)&b->unpacked = (byte)b->unpacked | 8;
    }
  }
  return 0;
}

Assistant:

int bcf_unpack(bcf1_t *b, int which)
{
    if ( !b->shared.l ) return 0; // Building a new BCF record from scratch
    uint8_t *ptr = (uint8_t*)b->shared.s, *ptr_ori;
    int *offset, i;
    bcf_dec_t *d = &b->d;
    if (which & BCF_UN_FLT) which |= BCF_UN_STR;
    if (which & BCF_UN_INFO) which |= BCF_UN_SHR;
    if ((which&BCF_UN_STR) && !(b->unpacked&BCF_UN_STR))
    {
        kstring_t tmp;

        // ID
        tmp.l = 0; tmp.s = d->id; tmp.m = d->m_id;
        ptr_ori = ptr;
        ptr = bcf_fmt_sized_array(&tmp, ptr);
        b->unpack_size[0] = ptr - ptr_ori;
        kputc('\0', &tmp);
        d->id = tmp.s; d->m_id = tmp.m;

        // REF and ALT are in a single block (d->als) and d->alleles are pointers into this block
        tmp.l = 0; tmp.s = d->als; tmp.m = d->m_als;
        offset = (int*)alloca(b->n_allele * sizeof(int));
        ptr_ori = ptr;
        for (i = 0; i < b->n_allele; ++i) {
            offset[i] = tmp.l;
            ptr = bcf_fmt_sized_array(&tmp, ptr);
            kputc('\0', &tmp);
        }
        b->unpack_size[1] = ptr - ptr_ori;
        d->als = tmp.s; d->m_als = tmp.m;

        hts_expand(char*, b->n_allele, d->m_allele, d->allele); // NM: hts_expand() is a macro
        for (i = 0; i < b->n_allele; ++i)
            d->allele[i] = d->als + offset[i];
        b->unpacked |= BCF_UN_STR;
    }
    if ((which&BCF_UN_FLT) && !(b->unpacked&BCF_UN_FLT)) { // FILTER
        ptr = (uint8_t*)b->shared.s + b->unpack_size[0] + b->unpack_size[1];
        ptr_ori = ptr;
        if (*ptr>>4) {
            int type;
            d->n_flt = bcf_dec_size(ptr, &ptr, &type);
            hts_expand(int, d->n_flt, d->m_flt, d->flt);
            for (i = 0; i < d->n_flt; ++i)
                d->flt[i] = bcf_dec_int1(ptr, type, &ptr);
        } else ++ptr, d->n_flt = 0;
        b->unpack_size[2] = ptr - ptr_ori;
        b->unpacked |= BCF_UN_FLT;
    }
    if ((which&BCF_UN_INFO) && !(b->unpacked&BCF_UN_INFO)) { // INFO
        ptr = (uint8_t*)b->shared.s + b->unpack_size[0] + b->unpack_size[1] + b->unpack_size[2];
        hts_expand(bcf_info_t, b->n_info, d->m_info, d->info);
        for (i = 0; i < d->m_info; ++i) d->info[i].vptr_free = 0;
        for (i = 0; i < b->n_info; ++i)
            ptr = bcf_unpack_info_core1(ptr, &d->info[i]);
        b->unpacked |= BCF_UN_INFO;
    }
    if ((which&BCF_UN_FMT) && b->n_sample && !(b->unpacked&BCF_UN_FMT)) { // FORMAT
        ptr = (uint8_t*)b->indiv.s;
        hts_expand(bcf_fmt_t, b->n_fmt, d->m_fmt, d->fmt);
        for (i = 0; i < d->m_fmt; ++i) d->fmt[i].p_free = 0;
        for (i = 0; i < b->n_fmt; ++i)
            ptr = bcf_unpack_fmt_core1(ptr, b->n_sample, &d->fmt[i]);
        b->unpacked |= BCF_UN_FMT;
    }
    return 0;
}